

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O1

void __thiscall jrtplib::RTPFakeTransmitter::AddLoopbackAddress(RTPFakeTransmitter *this)

{
  size_t *psVar1;
  bool bVar2;
  _List_node_base *p_Var3;
  
  p_Var3 = (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)&this->localIPs) {
    bVar2 = false;
    do {
      if (*(int *)&p_Var3[1]._M_next == 0x7f000001) {
        bVar2 = true;
      }
      if (bVar2) {
        return;
      }
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)&this->localIPs);
    if (bVar2) {
      return;
    }
  }
  p_Var3 = (_List_node_base *)operator_new(0x18);
  *(undefined4 *)&p_Var3[1]._M_next = 0x7f000001;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void RTPFakeTransmitter::AddLoopbackAddress()
{
	uint32_t loopbackaddr = (((uint32_t)127)<<24)|((uint32_t)1);
	std::list<uint32_t>::const_iterator it;
	bool found = false;
	
	for (it = localIPs.begin() ; !found && it != localIPs.end() ; it++)
	{
		if (*it == loopbackaddr)
			found = true;
	}

	if (!found)
		localIPs.push_back(loopbackaddr);
}